

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

uint32_t skiphunk(HunkInfo *hi)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  int iVar5;
  HunkInfo *in_RDI;
  uint32_t n;
  uint32_t type;
  HunkInfo *in_stack_ffffffffffffffc8;
  HunkInfo *in_stack_ffffffffffffffd0;
  int local_10;
  
  uVar2 = read32be(in_RDI->hunkptr);
  uVar3 = uVar2 & 0xffff;
  if (((uVar3 == 0x4e9) || ((1000 < uVar3 && (uVar3 < 0x3ec)))) &&
     ((uVar2 & 0xc0000000) == 0xc0000000)) {
    movehunkptr32(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  if (uVar3 - 999 < 4) goto LAB_00122868;
  if (uVar3 == 0x3eb) {
    movehunkptr32(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    goto LAB_00122ae1;
  }
  if (uVar3 - 0x3ec < 3) goto LAB_001228ac;
  if (uVar3 - 0x3ef < 2) {
    nextword32(in_stack_ffffffffffffffd0);
    while (uVar2 = nextword32(in_stack_ffffffffffffffd0), uVar2 != 0) {
      uVar4 = (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
      if ((uVar2 & 0x80000000) == 0) {
        movehunkptr32(in_stack_ffffffffffffffd0,uVar4);
      }
      else {
        movehunkptr32(in_stack_ffffffffffffffd0,uVar4);
        if (((uVar2 >> 0x18 == 0x82) || (uVar2 >> 0x18 == 0x89)) ||
           ((0xcf < uVar2 >> 0x18 && (uVar2 >> 0x18 < 0xd3)))) {
          nextword32(in_stack_ffffffffffffffd0);
        }
        nextword32(in_stack_ffffffffffffffd0);
        movehunkptr32(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                     );
      }
    }
    goto LAB_00122ae1;
  }
  if (uVar3 == 0x3f1) goto LAB_00122868;
  if (uVar3 == 0x3f2) {
LAB_00122ac0:
    nextword32(in_stack_ffffffffffffffd0);
    goto LAB_00122ae1;
  }
  if (uVar3 == 0x3f3) {
    nextword32(in_stack_ffffffffffffffd0);
    nextword32(in_RDI);
    movehunkptr32(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    uVar2 = nextword32(in_RDI);
    uVar4 = nextword32(in_RDI);
    local_10 = (uVar4 - uVar2) + 1;
    while (iVar5 = local_10 + -1, local_10 != 0) {
      uVar2 = nextword32(in_RDI);
      local_10 = iVar5;
      if ((uVar2 & 0xc0000000) == 0xc0000000) {
        nextword32(in_RDI);
      }
    }
    goto LAB_00122ae1;
  }
  if (uVar3 == 0x3f5) {
    read32be(in_RDI->hunkptr + 4);
    movehunkptr32(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffc8 = in_RDI;
    goto LAB_00122ae1;
  }
  if (uVar3 == 0x3f6) goto LAB_00122ac0;
  if (uVar3 - 0x3f7 < 3) {
LAB_001228ac:
    if ((uVar3 != 0x3f7) || (in_RDI->exec == 0)) {
      nextword32(in_stack_ffffffffffffffd0);
      while (uVar2 = nextword32(in_stack_ffffffffffffffd0), uVar2 != 0) {
        movehunkptr32(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                     );
      }
      goto LAB_00122ae1;
    }
  }
  else {
    if (uVar3 - 0x3fa < 2) {
LAB_00122868:
      read32be(in_RDI->hunkptr + 4);
      movehunkptr32(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
      goto LAB_00122ae1;
    }
    if (uVar3 != 0x3fc) {
      if (1 < uVar3 - 0x3fd) {
        if (uVar3 == 0x4e9) goto LAB_00122868;
        if (uVar3 != 0x4ec) {
          error(0xd,in_RDI->filename);
          goto LAB_00122ae1;
        }
      }
      goto LAB_001228ac;
    }
  }
  nextword32(in_stack_ffffffffffffffd0);
  while (uVar1 = nextword16(in_stack_ffffffffffffffd0), uVar1 != 0) {
    movehunkptr16(in_stack_ffffffffffffffd0,(uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  }
  alignhunkptr((HunkInfo *)0x122935);
LAB_00122ae1:
  uVar2 = testword32(in_stack_ffffffffffffffc8);
  return uVar2;
}

Assistant:

static uint32_t skiphunk(struct HunkInfo *hi)
/* Skip the hunk where hunkptr points to. */
/* Return first word of next hunk. */
{
  uint32_t type,n;

  n = read32be(hi->hunkptr);
  type = n & 0xffff;

  if ((type==HUNK_PPC_CODE || (type>=HUNK_CODE && type<=HUNK_BSS)) &&
      (n & HUNKF_MEMTYPE) == (HUNKF_FAST|HUNKF_CHIP))
    movehunkptr32(hi,1);  /* skip memory attributes @@@ inofficial! */

  switch (type) {
    case HUNK_UNIT:
    case HUNK_NAME:
    case HUNK_CODE:
    case HUNK_DATA:
    case HUNK_DEBUG:
    case HUNK_LIB:
    case HUNK_INDEX:
    case HUNK_PPC_CODE: /* EHF */
      movehunkptr32(hi,read32be(hi->hunkptr+4)+2);
      break;

    case HUNK_BSS:
      movehunkptr32(hi,2);  /* skip size specifier */
      break;

    case HUNK_ABSRELOC32:
    case HUNK_RELRELOC16:
    case HUNK_RELRELOC8:
    case HUNK_RELRELOC32:
    case HUNK_ABSRELOC16:
    case HUNK_DREL32:
    case HUNK_DREL16:
    case HUNK_DREL8:
    case HUNK_RELRELOC26: /* EHF */
      if (!(type==HUNK_DREL32 && hi->exec)) {
        nextword32(hi);
        while (n = nextword32(hi))
          movehunkptr32(hi,n+1);
        break;
      }
      /* else, fall through to HUNK_RELOC32SHORT */

    case HUNK_RELOC32SHORT:
      nextword32(hi);
      while (n = (uint32_t)nextword16(hi))
        movehunkptr16(hi,n+1);
      alignhunkptr(hi);
      break;

    case HUNK_EXT:
    case HUNK_SYMBOL:
      nextword32(hi);
      while (n = nextword32(hi)) {
        if (n & 0x80000000) {  /* external reference */
          movehunkptr32(hi,n & 0xffffff);
          if ((n>>24)==EXT_ABSCOMMON || (n>>24)==EXT_RELCOMMON ||
              ((n>>24)>=EXT_DEXT32COMMON && (n>>24)<=EXT_DEXT8COMMON)) {
            nextword32(hi);  /* size of common area */
          }
          movehunkptr32(hi,nextword32(hi));  /* skip reference offsets */
        }
        else
          movehunkptr32(hi,(n&0xffffff)+1);  /* skip xdef-value */
      }
      break;

    case HUNK_HEADER:
      nextword32(hi);
      movehunkptr32(hi,nextword32(hi)+2);
      n = nextword32(hi);  /* first root hunk index */
      n = nextword32(hi) - n + 1;  /* number of size specifiers */
      while (n--) {
        if ((nextword32(hi) & HUNKF_MEMTYPE) == (HUNKF_FAST|HUNKF_CHIP))
          nextword32(hi);
      }
      break;

    case HUNK_OVERLAY:
      movehunkptr32(hi,read32be(hi->hunkptr+4)+3); /* @@@ I'm not sure...*/
      break;

    case HUNK_END:
    case HUNK_BREAK:
      nextword32(hi);
      break;

    default:
      error(13,hi->filename);  /* File format corrupted */
      break;
  }

  /* return next 32-bit word */
  return testword32(hi);
}